

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_add_list_property(p_ply ply,char *name,e_ply_type length_type,e_ply_type value_type)

{
  size_t sVar1;
  p_ply_property_conflict __dest;
  e_ply_type in_ECX;
  e_ply_type in_EDX;
  char *in_RSI;
  p_ply in_RDI;
  p_ply_property_conflict property;
  p_ply_element element;
  p_ply_element element_00;
  int local_4;
  
  element_00 = (p_ply_element)0x0;
  sVar1 = strlen(in_RSI);
  if (sVar1 < 0x100) {
    if (((int)in_EDX < 0x10) && ((int)in_ECX < 0x10)) {
      __dest = ply_grow_property((p_ply)(in_RDI->element + in_RDI->nelements + -1),element_00);
      if (__dest == (p_ply_property_conflict)0x0) {
        local_4 = 0;
      }
      else {
        strcpy(__dest->name,in_RSI);
        __dest->type = PLY_LIST;
        __dest->length_type = in_EDX;
        __dest->value_type = in_ECX;
        local_4 = 1;
      }
    }
    else {
      ply_ferror(in_RDI,"Invalid arguments");
      local_4 = 0;
    }
  }
  else {
    ply_ferror(in_RDI,"Invalid arguments");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ply_add_list_property(p_ply ply, const char *name, e_ply_type length_type,
                          e_ply_type value_type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    if (strlen(name) >= WORDSIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    assert(length_type < PLY_LIST);
    assert(value_type < PLY_LIST);
    if (length_type >= PLY_LIST || value_type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = PLY_LIST;
    property->length_type = length_type;
    property->value_type = value_type;
    return 1;
}